

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.c
# Opt level: O0

uint8_t * apx_nodeData_take_require_port_data_snapshot(apx_nodeData_t *self)

{
  apx_nodeData_t *local_20;
  uint8_t *snapshot;
  apx_nodeData_t *self_local;
  
  if (self == (apx_nodeData_t *)0x0) {
    self_local = (apx_nodeData_t *)0x0;
  }
  else {
    local_20 = (apx_nodeData_t *)0x0;
    pthread_mutex_lock((pthread_mutex_t *)&self->lock);
    if ((self->require_port_data != (uint8_t *)0x0) &&
       (local_20 = (apx_nodeData_t *)malloc((ulong)self->require_port_data_size),
       local_20 != (apx_nodeData_t *)0x0)) {
      memcpy(local_20,self->require_port_data,(ulong)self->require_port_data_size);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
    self_local = local_20;
  }
  return (uint8_t *)self_local;
}

Assistant:

uint8_t* apx_nodeData_take_require_port_data_snapshot(apx_nodeData_t* self)
{
   if (self != NULL)
   {
      uint8_t* snapshot = NULL;
      MUTEX_LOCK(self->lock);
      if (self->require_port_data != NULL)
      {
         snapshot = (uint8_t*)malloc(self->require_port_data_size);
         if (snapshot != NULL)
         {
            memcpy(snapshot, self->require_port_data, self->require_port_data_size);
         }
      }
      MUTEX_UNLOCK(self->lock);
      return snapshot;
   }
   return NULL;
}